

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::missingArgsException(CmdLine *this)

{
  bool bVar1;
  uint uVar2;
  reference ppAVar3;
  string *psVar4;
  CmdLineParseException *this_00;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string msg;
  _Self local_48;
  _Self local_40;
  ArgListIterator it;
  string missingArgList;
  int count;
  CmdLine *this_local;
  
  missingArgList.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)&it);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(&this->_argList);
  while( true ) {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(&this->_argList);
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    ppAVar3 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_40);
    uVar2 = (*(*ppAVar3)->_vptr_Arg[5])();
    if ((uVar2 & 1) != 0) {
      ppAVar3 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_40);
      bVar1 = Arg::isSet(*ppAVar3);
      if (!bVar1) {
        ppAVar3 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_40);
        psVar4 = Arg::getName_abi_cxx11_(*ppAVar3);
        std::__cxx11::string::operator+=((string *)&it,(string *)psVar4);
        std::__cxx11::string::operator+=((string *)&it,", ");
        missingArgList.field_2._12_4_ = missingArgList.field_2._12_4_ + 1;
      }
    }
    std::_List_iterator<TCLAP::Arg_*>::operator++(&local_40,0);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)((long)&msg.field_2 + 8),(ulong)&it);
  std::__cxx11::string::operator=((string *)&it,(string *)(msg.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_a0);
  if ((int)missingArgList.field_2._12_4_ < 2) {
    std::__cxx11::string::operator=((string *)local_a0,"Required argument missing: ");
  }
  else {
    std::__cxx11::string::operator=((string *)local_a0,"Required arguments missing: ");
  }
  std::__cxx11::string::operator+=((string *)local_a0,(string *)&it);
  this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"undefined",&local_c1);
  CmdLineParseException::CmdLineParseException(this_00,(string *)local_a0,&local_c0);
  __cxa_throw(this_00,&CmdLineParseException::typeinfo,CmdLineParseException::~CmdLineParseException
             );
}

Assistant:

inline void CmdLine::missingArgsException()
{
		int count = 0;

		std::string missingArgList;
		for (ArgListIterator it = _argList.begin(); it != _argList.end(); it++)
		{
			if ( (*it)->isRequired() && !(*it)->isSet() )
			{
				missingArgList += (*it)->getName();
				missingArgList += ", ";
				count++;
			}
		}
		missingArgList = missingArgList.substr(0,missingArgList.length()-2);

		std::string msg;
		if ( count > 1 )
			msg = "Required arguments missing: ";
		else
			msg = "Required argument missing: ";

		msg += missingArgList;

		throw(CmdLineParseException(msg));
}